

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

FDynamicColormap * __thiscall F3DFloor::GetColormap(F3DFloor *this)

{
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 fade;
  FDynamicColormap *pFVar1;
  
  fade = (this->target->ColorMap->Fade).field_0.field_0;
  if (((fade != (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0) ||
      (pFVar1 = this->model->ColorMap, (pFVar1->Fade).field_0.d != 0)) &&
     (pFVar1 = this->model->ColorMap, (this->flags & 0x8001000) == 0)) {
    pFVar1 = GetSpecialLights((PalEntry)(pFVar1->Color).field_0.field_0,(PalEntry)fade,
                              pFVar1->Desaturate);
    return pFVar1;
  }
  return pFVar1;
}

Assistant:

FDynamicColormap *F3DFloor::GetColormap()
{
	// If there's no fog in either model or target sector this is easy and fast.
	if ((target->ColorMap->Fade == 0 && model->ColorMap->Fade == 0) || (flags & (FF_FADEWALLS|FF_FOG)))
	{
		return model->ColorMap;
	}
	else
	{
		// We must create a new colormap combining the properties we need
		return GetSpecialLights(model->ColorMap->Color, target->ColorMap->Fade, model->ColorMap->Desaturate);
	}
}